

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void __thiscall
Assimp::glTF2Exporter::GetMatTex
          (glTF2Exporter *this,aiMaterial *mat,Ref<glTF2::Texture> *texture,aiTextureType tt,
          uint slot)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  _Rb_tree_color _Var2;
  Asset *pAVar3;
  Texture *pTVar4;
  aiTexture **ppaVar5;
  aiTexture *paVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  uint uVar9;
  aiReturn aVar10;
  int iVar11;
  size_t sVar12;
  iterator iVar13;
  mapped_type_conflict3 *pmVar14;
  Ref<glTF2::Texture> RVar15;
  Ref<glTF2::Image> RVar16;
  string imgId;
  string mimeType;
  string path;
  string texId;
  aiString tex;
  string local_4c0;
  uint local_49c;
  string local_498;
  key_type local_478;
  string local_458;
  aiString local_434;
  
  uVar9 = aiGetMaterialTextureCount(mat,tt);
  if (uVar9 != 0) {
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    aVar10 = aiGetMaterialString(mat,"$tex.file",tt,slot,&local_434);
    if (aVar10 == aiReturn_SUCCESS) {
      __s = local_434.data;
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      local_49c = slot;
      sVar12 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,__s,__s + sVar12);
      if (local_478._M_string_length != 0) {
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->mTexturesByPath)._M_t,&local_478);
        if ((_Rb_tree_header *)iVar13._M_node !=
            &(this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header) {
          _Var2 = iVar13._M_node[2]._M_color;
          texture->vector =
               &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->textures).mObjs;
          texture->index = _Var2;
        }
        if (texture->vector == (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0) {
          pAVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"");
          glTF2::Asset::FindUniqueID(&local_458,pAVar3,&local_4c0,"texture");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          RVar15 = glTF2::LazyDict<glTF2::Texture>::Create
                             (&((this->mAsset).
                                super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->textures,local_458._M_dataplus._M_p);
          texture->vector = RVar15.vector;
          texture->index = RVar15.index;
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](&this->mTexturesByPath,&local_478);
          *pmVar14 = RVar15.index;
          pAVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          paVar1 = &local_498.field_2;
          local_498._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
          glTF2::Asset::FindUniqueID(&local_4c0,pAVar3,&local_498,"image");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != paVar1) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          RVar16 = glTF2::LazyDict<glTF2::Image>::Create
                             (&((this->mAsset).
                                super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->images,local_4c0._M_dataplus._M_p);
          pTVar4 = (texture->vector->
                   super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[texture->index];
          (pTVar4->source).vector = RVar16.vector;
          (pTVar4->source).index = RVar16.index;
          if (*local_478._M_dataplus._M_p == '*') {
            ppaVar5 = this->mScene->mTextures;
            iVar11 = atoi(local_478._M_dataplus._M_p + 1);
            paVar6 = ppaVar5[iVar11];
            pTVar4 = (texture->vector->
                     super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[texture->index];
            glTF2::Image::SetData
                      (*(Image **)
                        (*(long *)&((pTVar4->source).vector)->
                                   super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                        + (ulong)(pTVar4->source).index * 8),&paVar6->pcData->b,
                       (ulong)paVar6->mWidth,
                       (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            if (paVar6->achFormatHint[0] != '\0') {
              local_498._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"image/","");
              std::__cxx11::string::append((char *)&local_498);
              pTVar4 = (texture->vector->
                       super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[texture->index];
              std::__cxx11::string::_M_assign
                        ((string *)
                         (*(long *)(*(long *)&((pTVar4->source).vector)->
                                              super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                   + (ulong)(pTVar4->source).index * 8) + 0x80));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != paVar1) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
            }
          }
          else {
            pTVar4 = (texture->vector->
                     super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[texture->index];
            std::__cxx11::string::_M_assign
                      ((string *)
                       (*(long *)(*(long *)&((pTVar4->source).vector)->
                                            super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                 + (ulong)(pTVar4->source).index * 8) + 0x50));
          }
          uVar7 = texture->vector;
          uVar8 = texture->index;
          RVar15.index = uVar8;
          RVar15.vector = (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)uVar7;
          RVar15._12_4_ = 0;
          GetTexSampler(this,mat,RVar15,tt,local_49c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void glTF2Exporter::GetMatTex(const aiMaterial* mat, Ref<Texture>& texture, aiTextureType tt, unsigned int slot = 0)
{

    if (mat->GetTextureCount(tt) > 0) {
        aiString tex;

        if (mat->Get(AI_MATKEY_TEXTURE(tt, slot), tex) == AI_SUCCESS) {
            std::string path = tex.C_Str();

            if (path.size() > 0) {
                std::map<std::string, unsigned int>::iterator it = mTexturesByPath.find(path);
                if (it != mTexturesByPath.end()) {
                    texture = mAsset->textures.Get(it->second);
                }

                if (!texture) {
                    std::string texId = mAsset->FindUniqueID("", "texture");
                    texture = mAsset->textures.Create(texId);
                    mTexturesByPath[path] = texture.GetIndex();

                    std::string imgId = mAsset->FindUniqueID("", "image");
                    texture->source = mAsset->images.Create(imgId);

                    if (path[0] == '*') { // embedded
                        aiTexture* tex = mScene->mTextures[atoi(&path[1])];

                        uint8_t* data = reinterpret_cast<uint8_t*>(tex->pcData);
                        texture->source->SetData(data, tex->mWidth, *mAsset);

                        if (tex->achFormatHint[0]) {
                            std::string mimeType = "image/";
                            mimeType += (memcmp(tex->achFormatHint, "jpg", 3) == 0) ? "jpeg" : tex->achFormatHint;
                            texture->source->mimeType = mimeType;
                        }
                    }
                    else {
                        texture->source->uri = path;
                    }

                    GetTexSampler(mat, texture, tt, slot);
                }
            }
        }
    }
}